

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int bcf_hdr_register_hrec(bcf_hdr_t *hdr,bcf_hrec_t *hrec)

{
  uint uVar1;
  kh_vdict_t *h;
  int iVar2;
  uint uVar3;
  long lVar4;
  int local_84;
  vdict_t *d;
  char *pcStack_70;
  uint32_t info;
  char *tmp_1;
  int idx;
  int var;
  int num;
  int type;
  char *id;
  char *tmp;
  kh_vdict_t *pkStack_40;
  int idx_1;
  vdict_t *d_1;
  char *str;
  int ret;
  int k;
  int j;
  int i;
  bcf_hrec_t *hrec_local;
  bcf_hdr_t *hdr_local;
  
  _j = hrec;
  hrec_local = (bcf_hrec_t *)hdr;
  iVar2 = strcmp(hrec->key,"contig");
  if (iVar2 == 0) {
    _j->type = 3;
    k = bcf_hrec_find_key(_j,"length");
    if (k < 0) {
      ret = 0;
    }
    else {
      iVar2 = __isoc99_sscanf(_j->vals[k],"%d",&ret);
      if (iVar2 != 1) {
        return 0;
      }
    }
    k = bcf_hrec_find_key(_j,"ID");
    if (k < 0) {
      hdr_local._4_4_ = 0;
    }
    else {
      d_1 = (vdict_t *)strdup(_j->vals[k]);
      pkStack_40 = *(kh_vdict_t **)(hrec_local + 1);
      str._4_4_ = kh_put_vdict(pkStack_40,(kh_cstr_t)d_1,(int *)&str);
      if ((int)str == 0) {
        free(d_1);
        hdr_local._4_4_ = 0;
      }
      else {
        tmp._4_4_ = bcf_hrec_find_key(_j,"IDX");
        if (tmp._4_4_ == -1) {
          tmp._4_4_ = pkStack_40->size - 1;
          hrec_add_idx(_j,tmp._4_4_);
        }
        else {
          id = _j->vals[tmp._4_4_];
          lVar4 = strtol(_j->vals[tmp._4_4_],&id,10);
          tmp._4_4_ = (int)lVar4;
          if (*id != '\0') {
            fprintf(_stderr,"[%s:%d %s] Error parsing the IDX tag, skipping.\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                    ,0x178,"bcf_hdr_register_hrec");
            return 0;
          }
        }
        memcpy(pkStack_40->vals + (int)str._4_4_,&bcf_idinfo_def,0x30);
        pkStack_40->vals[(int)str._4_4_].id = tmp._4_4_;
        pkStack_40->vals[(int)str._4_4_].info[0] = ret;
        pkStack_40->vals[(int)str._4_4_].hrec[0] = _j;
        hdr_local._4_4_ = 1;
      }
    }
  }
  else {
    iVar2 = strcmp(_j->key,"INFO");
    if (iVar2 == 0) {
      _j->type = 1;
    }
    else {
      iVar2 = strcmp(_j->key,"FILTER");
      if (iVar2 == 0) {
        _j->type = 0;
      }
      else {
        iVar2 = strcmp(_j->key,"FORMAT");
        if (iVar2 != 0) {
          if (0 < _j->nkeys) {
            _j->type = 4;
            return 1;
          }
          return 0;
        }
        _j->type = 2;
      }
    }
    _num = (char *)0x0;
    var = -1;
    idx = -1;
    tmp_1._4_4_ = 0xffffffff;
    tmp_1._0_4_ = -1;
    for (k = 0; k < _j->nkeys; k = k + 1) {
      iVar2 = strcmp(_j->keys[k],"ID");
      if (iVar2 == 0) {
        _num = _j->vals[k];
      }
      else {
        iVar2 = strcmp(_j->keys[k],"IDX");
        if (iVar2 == 0) {
          pcStack_70 = _j->vals[k];
          lVar4 = strtol(_j->vals[k],&stack0xffffffffffffff90,10);
          tmp_1._0_4_ = (int)lVar4;
          if (*pcStack_70 != '\0') {
            fprintf(_stderr,"[%s:%d %s] Error parsing the IDX tag, skipping.\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                    ,0x19c,"bcf_hdr_register_hrec");
            return 0;
          }
        }
        else {
          iVar2 = strcmp(_j->keys[k],"Type");
          if (iVar2 == 0) {
            iVar2 = strcmp(_j->vals[k],"Integer");
            if (iVar2 == 0) {
              var = 1;
            }
            else {
              iVar2 = strcmp(_j->vals[k],"Float");
              if (iVar2 == 0) {
                var = 2;
              }
              else {
                iVar2 = strcmp(_j->vals[k],"String");
                if (iVar2 == 0) {
                  var = 3;
                }
                else {
                  iVar2 = strcmp(_j->vals[k],"Character");
                  if (iVar2 == 0) {
                    var = 3;
                  }
                  else {
                    iVar2 = strcmp(_j->vals[k],"Flag");
                    if (iVar2 == 0) {
                      var = 0;
                    }
                    else {
                      fprintf(_stderr,"[E::%s] The type \"%s\" not supported, assuming \"String\"\n"
                              ,"bcf_hdr_register_hrec",_j->vals[k]);
                      var = 3;
                    }
                  }
                }
              }
            }
          }
          else {
            iVar2 = strcmp(_j->keys[k],"Number");
            if (iVar2 == 0) {
              iVar2 = strcmp(_j->vals[k],"A");
              if (iVar2 == 0) {
                tmp_1._4_4_ = 2;
              }
              else {
                iVar2 = strcmp(_j->vals[k],"R");
                if (iVar2 == 0) {
                  tmp_1._4_4_ = 4;
                }
                else {
                  iVar2 = strcmp(_j->vals[k],"G");
                  if (iVar2 == 0) {
                    tmp_1._4_4_ = 3;
                  }
                  else {
                    iVar2 = strcmp(_j->vals[k],".");
                    if (iVar2 != 0) {
                      __isoc99_sscanf(_j->vals[k],"%d",&idx);
                    }
                    tmp_1._4_4_ = (uint)(iVar2 == 0);
                  }
                }
              }
              if (tmp_1._4_4_ != 0) {
                idx = 0xfffff;
              }
            }
          }
        }
      }
    }
    uVar1 = _j->type;
    uVar3 = idx << 0xc | tmp_1._4_4_ << 8 | var << 4 | uVar1;
    if (_num == (char *)0x0) {
      hdr_local._4_4_ = 0;
    }
    else {
      d_1 = (vdict_t *)strdup(_num);
      h = (kh_vdict_t *)hrec_local->vals;
      str._4_4_ = kh_put_vdict(h,(kh_cstr_t)d_1,(int *)&str);
      if ((int)str == 0) {
        free(d_1);
        if (h->vals[(int)str._4_4_].hrec[uVar1 & 0xf] == (bcf_hrec_t *)0x0) {
          h->vals[(int)str._4_4_].info[uVar1 & 0xf] = uVar3;
          h->vals[(int)str._4_4_].hrec[uVar1 & 0xf] = _j;
          if ((int)tmp_1 == -1) {
            hrec_add_idx(_j,h->vals[(int)str._4_4_].id);
          }
          hdr_local._4_4_ = 1;
        }
        else {
          hdr_local._4_4_ = 0;
        }
      }
      else {
        memcpy(h->vals + (int)str._4_4_,&bcf_idinfo_def,0x30);
        h->vals[(int)str._4_4_].info[uVar1 & 0xf] = uVar3;
        h->vals[(int)str._4_4_].hrec[uVar1 & 0xf] = _j;
        if ((int)tmp_1 == -1) {
          local_84 = h->size - 1;
        }
        else {
          local_84 = (int)tmp_1;
        }
        h->vals[(int)str._4_4_].id = local_84;
        if ((int)tmp_1 == -1) {
          hrec_add_idx(_j,h->vals[(int)str._4_4_].id);
        }
        hdr_local._4_4_ = 1;
      }
    }
  }
  return hdr_local._4_4_;
}

Assistant:

int bcf_hdr_register_hrec(bcf_hdr_t *hdr, bcf_hrec_t *hrec)
{
    // contig
    int i,j,k, ret;
    char *str;
    if ( !strcmp(hrec->key, "contig") )
    {
        hrec->type = BCF_HL_CTG;

        // Get the contig ID ($str) and length ($j)
        i = bcf_hrec_find_key(hrec,"length");
        if ( i<0 ) j = 0;
        else if ( sscanf(hrec->vals[i],"%d",&j)!=1 ) return 0;

        i = bcf_hrec_find_key(hrec,"ID");
        if ( i<0 ) return 0;
        str = strdup(hrec->vals[i]);

        // Register in the dictionary
        vdict_t *d = (vdict_t*)hdr->dict[BCF_DT_CTG];
        k = kh_put(vdict, d, str, &ret);
        if ( !ret ) { free(str); return 0; }    // already present

        int idx = bcf_hrec_find_key(hrec,"IDX");
        if ( idx!=-1 )
        {
            char *tmp = hrec->vals[idx];
            idx = strtol(hrec->vals[idx], &tmp, 10);
            if ( *tmp )
            {
                fprintf(stderr,"[%s:%d %s] Error parsing the IDX tag, skipping.\n", __FILE__,__LINE__,__FUNCTION__);
                return 0;
            }
        }
        else
        {
            idx = kh_size(d) - 1;
            hrec_add_idx(hrec, idx);
        }

        kh_val(d, k) = bcf_idinfo_def;
        kh_val(d, k).id = idx;
        kh_val(d, k).info[0] = j;
        kh_val(d, k).hrec[0] = hrec;

        return 1;
    }

    if ( !strcmp(hrec->key, "INFO") ) hrec->type = BCF_HL_INFO;
    else if ( !strcmp(hrec->key, "FILTER") ) hrec->type = BCF_HL_FLT;
    else if ( !strcmp(hrec->key, "FORMAT") ) hrec->type = BCF_HL_FMT;
    else if ( hrec->nkeys>0 ) { hrec->type = BCF_HL_STR; return 1; }
    else return 0;

    // INFO/FILTER/FORMAT
    char *id = NULL;
    int type = -1, num = -1, var = -1, idx = -1;
    for (i=0; i<hrec->nkeys; i++)
    {
        if ( !strcmp(hrec->keys[i], "ID") ) id = hrec->vals[i];
        else if ( !strcmp(hrec->keys[i], "IDX") )
        {
            char *tmp = hrec->vals[i];
            idx = strtol(hrec->vals[i], &tmp, 10);
            if ( *tmp )
            {
                fprintf(stderr,"[%s:%d %s] Error parsing the IDX tag, skipping.\n", __FILE__,__LINE__,__FUNCTION__);
                return 0;
            }
        }
        else if ( !strcmp(hrec->keys[i], "Type") )
        {
            if ( !strcmp(hrec->vals[i], "Integer") ) type = BCF_HT_INT;
            else if ( !strcmp(hrec->vals[i], "Float") ) type = BCF_HT_REAL;
            else if ( !strcmp(hrec->vals[i], "String") ) type = BCF_HT_STR;
            else if ( !strcmp(hrec->vals[i], "Character") ) type = BCF_HT_STR;
            else if ( !strcmp(hrec->vals[i], "Flag") ) type = BCF_HT_FLAG;
            else
            {
                fprintf(stderr, "[E::%s] The type \"%s\" not supported, assuming \"String\"\n", __func__, hrec->vals[i]);
                type = BCF_HT_STR;
            }
        }
        else if ( !strcmp(hrec->keys[i], "Number") )
        {
            if ( !strcmp(hrec->vals[i],"A") ) var = BCF_VL_A;
            else if ( !strcmp(hrec->vals[i],"R") ) var = BCF_VL_R;
            else if ( !strcmp(hrec->vals[i],"G") ) var = BCF_VL_G;
            else if ( !strcmp(hrec->vals[i],".") ) var = BCF_VL_VAR;
            else
            {
                sscanf(hrec->vals[i],"%d",&num);
                var = BCF_VL_FIXED;
            }
            if (var != BCF_VL_FIXED) num = 0xfffff;
        }
    }
    uint32_t info = (uint32_t)num<<12 | var<<8 | type<<4 | hrec->type;

    if ( !id ) return 0;
    str = strdup(id);

    vdict_t *d = (vdict_t*)hdr->dict[BCF_DT_ID];
    k = kh_put(vdict, d, str, &ret);
    if ( !ret )
    {
        // already present
        free(str);
        if ( kh_val(d, k).hrec[info&0xf] ) return 0;
        kh_val(d, k).info[info&0xf] = info;
        kh_val(d, k).hrec[info&0xf] = hrec;
        if ( idx==-1 ) hrec_add_idx(hrec, kh_val(d, k).id);
        return 1;
    }
    kh_val(d, k) = bcf_idinfo_def;
    kh_val(d, k).info[info&0xf] = info;
    kh_val(d, k).hrec[info&0xf] = hrec;
    kh_val(d, k).id = idx==-1 ? kh_size(d) - 1 : idx;

    if ( idx==-1 ) hrec_add_idx(hrec, kh_val(d, k).id);

    return 1;
}